

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::output_two_particle_correlation_rap(singleParticleSpectra *this)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  string *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double Cn2_os_err;
  double Cn2_os_stdsq;
  double Cn2_os_avg;
  double Cn2_ss_err;
  double Cn2_ss_stdsq;
  double Cn2_ss_avg;
  double vn2_err_1;
  double vn2_avg_1;
  int i_1;
  double num_pair_os_err;
  double num_pair_os_stdsq;
  double num_pair_os;
  double num_pair_ss_err;
  double num_pair_ss_stdsq;
  double num_pair_ss;
  double eta_local_1;
  int j;
  ofstream output_os;
  ofstream output_ss;
  ostringstream filename_os;
  ostringstream filename_ss;
  double Qn2_err;
  double Qn2_stdsq;
  double Qn2_avg;
  double vn2_err;
  double vn2_avg;
  int iorder;
  double num_pair_err;
  double num_pair_stdsq;
  double num_pair;
  double eta_local;
  int i;
  ofstream output;
  ostringstream filename;
  double local_bb0;
  double local_ba8;
  int local_b9c;
  double local_b90;
  double local_b70;
  int local_b4c;
  string local_b48 [32];
  ostream local_b28 [512];
  string local_928 [32];
  ostream local_908 [512];
  ostringstream local_708 [376];
  ostringstream local_590 [376];
  int local_418;
  int local_414;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  int local_3b4;
  string local_3b0 [32];
  ostream local_390 [528];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar3 = std::operator<<((ostream *)local_180,in_RDI);
  poVar3 = std::operator<<(poVar3,"/particle_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  poVar3 = std::operator<<(poVar3,"_vn2_eta12");
  poVar3 = std::operator<<(poVar3,"_pT_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
  std::operator<<(poVar3,".dat");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_390,pcVar4,_S_out);
  std::__cxx11::string::~string(local_3b0);
  if (*(int *)(in_RDI + 0x238) == 0) {
    poVar3 = std::operator<<(local_390,"# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<(local_390,"# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  for (local_3b4 = 0; local_3b4 < *(int *)(in_RDI + 0x254); local_3b4 = local_3b4 + 1) {
    local_3c0 = (double)local_3b4 * *(double *)(in_RDI + 0x268) + *(double *)(in_RDI + 600);
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x448),0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3b4);
    local_3c8 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x460),0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3b4);
    local_3d0 = -local_3c8 * local_3c8 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
    local_3d8 = 0.0;
    if (0.0 < local_3d0) {
      local_3d8 = sqrt(local_3d0 / (double)*(int *)(in_RDI + 0x2f8));
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
    local_3dc = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_3dc);
    local_3e0 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_3e0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c0);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c8);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d8);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c8);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x400),0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6 / (double)*(int *)(in_RDI + 0x2f8));
    std::operator<<(poVar3,"  ");
    for (local_3e4 = 1; local_3e4 < *(int *)(in_RDI + 0x1c8); local_3e4 = local_3e4 + 1) {
      local_3f0 = 0.0;
      local_3f8 = 0.0;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x448),(long)local_3e4);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3b4);
      local_400 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      if (0.0 < local_400) {
        local_3f0 = sqrt(local_400 / local_3c8);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x460),(long)local_3e4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3b4);
        local_408 = -local_400 * local_400 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        if (0.0 < local_408) {
          local_410 = sqrt(local_408 / (double)*(int *)(in_RDI + 0x2f8));
          local_3f8 = local_410 / local_3c8;
        }
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
      local_414 = (int)std::setw(0x12);
      poVar3 = std::operator<<(poVar3,(_Setw)local_414);
      local_418 = (int)std::setprecision(8);
      poVar3 = std::operator<<(poVar3,(_Setprecision)local_418);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3f0);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3f8);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_400);
      poVar3 = std::operator<<(poVar3,"  ");
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x460),(long)local_3e4);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3b4);
      poVar3 = (ostream *)
               std::ostream::operator<<(poVar3,*pvVar6 / (double)*(int *)(in_RDI + 0x2f8));
      std::operator<<(poVar3,"  ");
    }
    std::ostream::operator<<(local_390,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  if (*(int *)(in_RDI + 0x5d0) == 1) {
    std::__cxx11::ostringstream::ostringstream(local_590);
    std::__cxx11::ostringstream::ostringstream(local_708);
    poVar3 = std::operator<<((ostream *)local_590,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_vn2_eta12_ss");
    poVar3 = std::operator<<(poVar3,"_pT_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
    std::operator<<(poVar3,".dat");
    poVar3 = std::operator<<((ostream *)local_708,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_vn2_eta12_os");
    poVar3 = std::operator<<(poVar3,"_pT_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
    std::operator<<(poVar3,".dat");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_908,pcVar4,_S_out);
    std::__cxx11::string::~string(local_928);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_b28,pcVar4,_S_out);
    std::__cxx11::string::~string(local_b48);
    if (*(int *)(in_RDI + 0x238) == 0) {
      poVar3 = std::operator<<(local_908,"# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_b28,"# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<(local_908,"# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_b28,"# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    for (local_b4c = 0; local_b4c < *(int *)(in_RDI + 0x254); local_b4c = local_b4c + 1) {
      dVar7 = (double)local_b4c * *(double *)(in_RDI + 0x268) + *(double *)(in_RDI + 600);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x4d8),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
      dVar8 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x4f0),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
      dVar9 = -dVar8 * dVar8 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_b70 = 0.0;
      if (0.0 < dVar9) {
        local_b70 = sqrt(dVar9 / (double)*(int *)(in_RDI + 0x2f8));
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_908,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b70);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
      poVar3 = std::operator<<(poVar3,"  ");
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x4f0),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
      std::ostream::operator<<(poVar3,*pvVar6 / (double)*(int *)(in_RDI + 0x2f8));
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x508),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
      dVar9 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x520),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
      dVar10 = -dVar9 * dVar9 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_b90 = 0.0;
      if (0.0 < dVar10) {
        local_b90 = sqrt(dVar10 / (double)*(int *)(in_RDI + 0x2f8));
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_b28,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b90);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      poVar3 = std::operator<<(poVar3,"  ");
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x520),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
      std::ostream::operator<<(poVar3,*pvVar6 / (double)*(int *)(in_RDI + 0x2f8));
      for (local_b9c = 1; local_b9c < *(int *)(in_RDI + 0x1c8); local_b9c = local_b9c + 1) {
        local_ba8 = 0.0;
        local_bb0 = 0.0;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x4d8),(long)local_b9c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
        dVar7 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        if (0.0 < dVar7) {
          local_ba8 = sqrt(dVar7 / dVar8);
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x4f0),(long)local_b9c);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
          dVar10 = -dVar7 * dVar7 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
          if (0.0 < dVar10) {
            local_bb0 = sqrt(dVar10 / (double)*(int *)(in_RDI + 0x2f8));
            local_bb0 = local_bb0 / dVar8;
          }
        }
        poVar3 = (ostream *)std::ostream::operator<<(local_908,std::scientific);
        _Var1 = std::setw(0x12);
        poVar3 = std::operator<<(poVar3,_Var1);
        _Var2 = std::setprecision(8);
        poVar3 = std::operator<<(poVar3,_Var2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_ba8);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bb0);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
        poVar3 = std::operator<<(poVar3,"  ");
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x4f0),(long)local_b9c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,*pvVar6 / (double)*(int *)(in_RDI + 0x2f8));
        std::operator<<(poVar3,"  ");
        local_ba8 = 0.0;
        local_bb0 = 0.0;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x508),(long)local_b9c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
        dVar7 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        if (0.0 < dVar7) {
          local_ba8 = sqrt(dVar7 / dVar9);
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x520),(long)local_b9c);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
          dVar10 = -dVar7 * dVar7 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
          if (0.0 < dVar10) {
            local_bb0 = sqrt(dVar10 / (double)*(int *)(in_RDI + 0x2f8));
            local_bb0 = local_bb0 / dVar9;
          }
        }
        poVar3 = (ostream *)std::ostream::operator<<(local_b28,std::scientific);
        _Var1 = std::setw(0x12);
        poVar3 = std::operator<<(poVar3,_Var1);
        _Var2 = std::setprecision(8);
        poVar3 = std::operator<<(poVar3,_Var2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_ba8);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bb0);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
        poVar3 = std::operator<<(poVar3,"  ");
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x520),(long)local_b9c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_b4c);
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,*pvVar6 / (double)*(int *)(in_RDI + 0x2f8));
        std::operator<<(poVar3,"  ");
      }
      std::ostream::operator<<(local_908,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_b28,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(local_b28);
    std::ofstream::~ofstream(local_908);
    std::__cxx11::ostringstream::~ostringstream(local_708);
    std::__cxx11::ostringstream::~ostringstream(local_590);
  }
  std::ofstream::~ofstream(local_390);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void singleParticleSpectra::output_two_particle_correlation_rap() {
    ostringstream filename;
    filename << path_ << "/particle_" << particle_monval << "_vn2_eta12"
             << "_pT_" << vn_rapidity_dis_pT_min << "_"
             << vn_rapidity_dis_pT_max << ".dat";
    ofstream output(filename.str().c_str());
    if (rap_type == 0) {
        output << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    } else {
        output << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    }

    for (int i = 0; i < N_rap; i++) {
        double eta_local = rapidity_dis_min + i * drap;
        double num_pair = QnSP_eta12[0][i] / total_number_of_events;
        double num_pair_stdsq =
            (QnSP_eta12_err[0][i] / total_number_of_events
             - num_pair * num_pair);
        double num_pair_err = 0.0;
        if (num_pair_stdsq > 0) {
            num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
        }
        output << scientific << setw(18) << setprecision(8) << eta_local << "  "
               << num_pair << "  " << num_pair_err << "  " << num_pair << "  "
               << Qn2_vector_err[0] / total_number_of_events << "  ";
        for (int iorder = 1; iorder < order_max; iorder++) {
            double vn2_avg = 0.0;
            double vn2_err = 0.0;
            double Qn2_avg = QnSP_eta12[iorder][i] / total_number_of_events;
            if (Qn2_avg > 0.) {
                vn2_avg = sqrt(Qn2_avg / num_pair);
                double Qn2_stdsq =
                    (QnSP_eta12_err[iorder][i] / total_number_of_events
                     - Qn2_avg * Qn2_avg);
                if (Qn2_stdsq > 0) {
                    double Qn2_err = sqrt(Qn2_stdsq / total_number_of_events);
                    vn2_err = Qn2_err / num_pair;
                }
            }
            output << scientific << setw(18) << setprecision(8) << vn2_avg
                   << "  " << vn2_err << "  " << Qn2_avg << "  "
                   << QnSP_eta12_err[iorder][i] / total_number_of_events
                   << "  ";
        }
        output << endl;
    }
    output.close();

    if (flag_charge_dependence == 1) {
        ostringstream filename_ss, filename_os;
        filename_ss << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_ss"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        filename_os << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_os"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        ofstream output_ss(filename_ss.str().c_str());
        ofstream output_os(filename_os.str().c_str());
        if (rap_type == 0) {
            output_ss
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        } else {
            output_ss
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        }
        for (int j = 0; j < N_rap; j++) {
            double eta_local = rapidity_dis_min + j * drap;

            double num_pair_ss = Cn2_ss_eta12[0][j] / total_number_of_events;
            double num_pair_ss_stdsq =
                (Cn2_ss_eta12_err[0][j] / total_number_of_events
                 - num_pair_ss * num_pair_ss);
            double num_pair_ss_err = 0.0;
            if (num_pair_ss_stdsq > 0) {
                num_pair_ss_err =
                    (sqrt(num_pair_ss_stdsq / total_number_of_events));
            }
            output_ss << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_ss << "  " << num_pair_ss_err << "  "
                      << num_pair_ss << "  "
                      << Cn2_ss_eta12_err[0][j] / total_number_of_events;

            double num_pair_os = Cn2_os_eta12[0][j] / total_number_of_events;
            double num_pair_os_stdsq =
                (Cn2_os_eta12_err[0][j] / total_number_of_events
                 - num_pair_os * num_pair_os);
            double num_pair_os_err = 0.0;
            if (num_pair_os_stdsq > 0) {
                num_pair_os_err =
                    (sqrt(num_pair_os_stdsq / total_number_of_events));
            }
            output_os << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_os << "  " << num_pair_os_err << "  "
                      << num_pair_os << "  "
                      << Cn2_os_eta12_err[0][j] / total_number_of_events;

            for (int i = 1; i < order_max; i++) {
                double vn2_avg = 0.0;
                double vn2_err = 0.0;
                double Cn2_ss_avg =
                    (Cn2_ss_eta12[i][j] / total_number_of_events);
                if (Cn2_ss_avg > 0.) {
                    vn2_avg = sqrt(Cn2_ss_avg / num_pair_ss);
                    double Cn2_ss_stdsq =
                        (Cn2_ss_eta12_err[i][j] / total_number_of_events
                         - Cn2_ss_avg * Cn2_ss_avg);
                    double Cn2_ss_err = 0.0;
                    if (Cn2_ss_stdsq > 0) {
                        Cn2_ss_err =
                            sqrt(Cn2_ss_stdsq / total_number_of_events);
                        vn2_err = Cn2_ss_err / num_pair_ss;
                    }
                }
                output_ss << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_ss_avg
                          << "  "
                          << Cn2_ss_eta12_err[i][j] / total_number_of_events
                          << "  ";

                vn2_avg = 0.0;
                vn2_err = 0.0;
                double Cn2_os_avg =
                    (Cn2_os_eta12[i][j] / total_number_of_events);
                if (Cn2_os_avg > 0.) {
                    vn2_avg = sqrt(Cn2_os_avg / num_pair_os);
                    double Cn2_os_stdsq =
                        (Cn2_os_eta12_err[i][j] / total_number_of_events
                         - Cn2_os_avg * Cn2_os_avg);
                    double Cn2_os_err = 0.0;
                    if (Cn2_os_stdsq > 0) {
                        Cn2_os_err =
                            sqrt(Cn2_os_stdsq / total_number_of_events);
                        vn2_err = Cn2_os_err / num_pair_os;
                    }
                }
                output_os << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_os_avg
                          << "  "
                          << Cn2_os_eta12_err[i][j] / total_number_of_events
                          << "  ";
            }
            output_ss << endl;
            output_os << endl;
        }
        output_ss.close();
        output_os.close();
    }
}